

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBSTest_ParseASN1Tag_Test::TestBody(CBSTest_ParseASN1Tag_Test *this)

{
  bool *lhs;
  void *pvVar1;
  uchar uVar2;
  int iVar3;
  long lVar4;
  pointer *__ptr;
  bool *lhs_00;
  char *pcVar5;
  char *in_R9;
  bool bVar6;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_305;
  AssertionResult gtest_ar;
  CBS cbs;
  CBS_ASN1_TAG tag;
  CBS child;
  anon_struct_32_3_59c873d7 kTests [10];
  AssertHelper local_208;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  undefined2 local_1ea;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  AssertHelper local_1c8;
  allocator_type local_1ba;
  allocator_type local_1b9;
  allocator_type local_1b8;
  allocator_type local_1b7;
  allocator_type local_1b6;
  allocator_type local_1b5;
  allocator_type local_1b4;
  allocator_type local_1b3;
  allocator_type local_1b2;
  allocator_type local_1b1;
  CBS local_1b0;
  undefined4 local_19c;
  long local_198;
  undefined8 uStack_190;
  undefined1 local_188 [8];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  bool local_178 [4];
  undefined4 local_174;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_170;
  undefined1 local_158;
  undefined4 local_154;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  undefined1 local_138;
  undefined4 local_134;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  undefined1 local_118;
  undefined4 local_114;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  undefined1 local_f8;
  undefined4 local_f4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  undefined1 local_d8;
  undefined4 local_d4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  undefined1 local_b8;
  undefined4 local_b4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  undefined1 local_98;
  undefined4 local_94;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  undefined1 local_78;
  undefined4 local_74;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_58;
  undefined4 local_54;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  
  local_178[0] = true;
  local_174 = 0x20000010;
  local_1ea = 0x30;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_1ea;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_170,__l,&local_1b1);
  local_158 = 1;
  local_154 = 0xa0000004;
  uStack_190._6_2_ = 0xa4;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)((long)&uStack_190 + 6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_150,__l_00,&local_1b2);
  local_138 = 1;
  local_134 = 0x4000001e;
  uStack_190._4_2_ = 0x5e;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)((long)&uStack_190 + 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_130,__l_01,&local_1b3);
  local_118 = 1;
  local_114 = 0x4000001f;
  local_1c8.data_._0_2_ = 0x1f5f;
  local_1c8.data_._2_1_ = 0;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_110,__l_02,&local_1b4);
  local_f8 = 1;
  local_f4 = 0x40000020;
  local_19c._0_2_ = 0x205f;
  local_19c._2_1_ = 0;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_19c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f0,__l_03,&local_1b5);
  local_d8 = 1;
  local_d4 = 0xffffffff;
  local_1e8._0_7_ = 0x7fffffff81ff;
  __l_04._M_len = 7;
  __l_04._M_array = local_1e8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_d0,__l_04,&local_1b6);
  local_b8 = 0;
  local_b4 = 0;
  local_1b0.data = (uint8_t *)CONCAT17(local_1b0.data._7_1_,0x7fffffff82ff);
  __l_05._M_len = 7;
  __l_05._M_array = (iterator)&local_1b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_b0,__l_05,&local_1b7);
  local_98 = 0;
  local_94 = 0;
  local_188._0_4_ = 0x808090ff;
  local_188._4_2_ = 0x80;
  local_188[6] = 0;
  __l_06._M_len = 7;
  __l_06._M_array = local_188;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_90,__l_06,&local_1b8);
  local_78 = 0;
  local_74 = 0;
  local_200._M_head_impl._0_4_ = 0x1f805f;
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)&local_200;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_70,__l_07,&local_1b9);
  local_58 = 0;
  local_54 = 0;
  local_208.data_._0_4_ = 0x1e805f;
  __l_08._M_len = 4;
  __l_08._M_array = (iterator)&local_208;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50,__l_08,&local_1ba);
  lhs_00 = local_178;
  lVar4 = 0x120;
  do {
    local_1e8 = *(undefined1 (*) [8])(lhs_00 + 8);
    local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(long *)(lhs_00 + 0x10) - (long)local_1e8);
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_1ea,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x131,(Bytes *)local_1e8);
    local_1b0.data = *(uint8_t **)(lhs_00 + 8);
    local_1b0.len = *(long *)(lhs_00 + 0x10) - (long)local_1b0.data;
    iVar3 = CBS_get_any_asn1(&local_1b0,(CBS *)local_188,&local_19c);
    local_200._M_head_impl._0_1_ = iVar3 != 0;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_1e8,"t.ok","!!CBS_get_any_asn1(&cbs, &child, &tag)",lhs_00,
               (bool *)&local_200);
    uVar2 = local_1e8[0];
    if (local_1e8[0] == '\0') {
      testing::Message::Message((Message *)&local_200);
      if (local_1e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_1e0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x135,pcVar5);
      testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
      testing::internal::AssertHelper::~AssertHelper(&local_208);
      if (local_200._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_200._M_head_impl + 8))();
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_1ea);
      break;
    }
    if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e0,local_1e0);
    }
    if (*lhs_00 == true) {
      lhs = lhs_00 + 4;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_1e8,"t.tag","tag",(uint *)lhs,&local_19c);
      if (local_1e8[0] == '\0') {
        testing::Message::Message((Message *)&local_200);
        pcVar5 = "";
        if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x137,pcVar5);
        testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        if (local_200._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_200._M_head_impl + 8))();
        }
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
      local_208.data_._0_4_ = 0;
      local_200._M_head_impl = local_180;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_1e8,"0u","CBS_len(&child)",(uint *)&local_208,
                 (unsigned_long *)&local_200);
      if (local_1e8[0] == '\0') {
        testing::Message::Message((Message *)&local_200);
        pcVar5 = "";
        if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x138,pcVar5);
        testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        if (local_200._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_200._M_head_impl + 8))();
        }
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
      local_208.data_._0_4_ = 0;
      local_200._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_1e8,"0u","CBS_len(&cbs)",(uint *)&local_208,
                 (unsigned_long *)&local_200);
      if (local_1e8[0] == '\0') {
        testing::Message::Message((Message *)&local_200);
        pcVar5 = "";
        if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x139,pcVar5);
        testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        if (local_200._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_200._M_head_impl + 8))();
        }
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
      local_1b0.data = *(uint8_t **)(lhs_00 + 8);
      local_1b0.len = *(long *)(lhs_00 + 0x10) - (long)local_1b0.data;
      iVar3 = CBS_peek_asn1_tag(&local_1b0,*(CBS_ASN1_TAG *)(lhs_00 + 4));
      local_200._M_head_impl._0_1_ = iVar3 != 0;
      local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_198 = lVar4;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1e8,(internal *)&local_200,
                   (AssertionResult *)"CBS_peek_asn1_tag(&cbs, t.tag)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x13c,(char *)local_1e8);
        testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        if (local_1e8 != (undefined1  [8])&local_1d8) {
          operator_delete((void *)local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        lVar4 = local_198;
        if ((long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) + 8))();
        }
      }
      if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1f8,local_1f8);
      }
      iVar3 = CBS_peek_asn1_tag(&local_1b0,*(uint *)lhs + 1);
      local_200._M_head_impl._0_1_ = iVar3 == 0;
      local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 != 0) {
        testing::Message::Message((Message *)&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1e8,(internal *)&local_200,
                   (AssertionResult *)"CBS_peek_asn1_tag(&cbs, t.tag + 1)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x13d,(char *)local_1e8);
        testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        if (local_1e8 != (undefined1  [8])&local_1d8) {
          operator_delete((void *)local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        lVar4 = local_198;
        if ((long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) + 8))();
        }
      }
      if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1f8,local_1f8);
      }
      iVar3 = CBS_get_asn1(&local_1b0,(CBS *)local_188,*(CBS_ASN1_TAG *)lhs);
      local_200._M_head_impl._0_1_ = iVar3 != 0;
      local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1e8,(internal *)&local_200,
                   (AssertionResult *)"CBS_get_asn1(&cbs, &child, t.tag)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x13f,(char *)local_1e8);
        testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        if (local_1e8 != (undefined1  [8])&local_1d8) {
          operator_delete((void *)local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        lVar4 = local_198;
        if ((long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) + 8))();
        }
      }
      if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1f8,local_1f8);
      }
      local_208.data_._0_4_ = 0;
      local_200._M_head_impl = local_180;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_1e8,"0u","CBS_len(&child)",(uint *)&local_208,
                 (unsigned_long *)&local_200);
      if (local_1e8[0] == '\0') {
        testing::Message::Message((Message *)&local_200);
        pcVar5 = "";
        if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x140,pcVar5);
        testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        if (local_200._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_200._M_head_impl + 8))();
        }
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
      local_208.data_._0_4_ = 0;
      local_200._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_1e8,"0u","CBS_len(&cbs)",(uint *)&local_208,
                 (unsigned_long *)&local_200);
      if (local_1e8[0] == '\0') {
        testing::Message::Message((Message *)&local_200);
        pcVar5 = "";
        if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_1e0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_208,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x141,pcVar5);
        testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_200);
        testing::internal::AssertHelper::~AssertHelper(&local_208);
        if (local_200._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_200._M_head_impl + 8))();
        }
      }
      if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e0,local_1e0);
      }
      local_1b0.data = *(uint8_t **)(lhs_00 + 8);
      local_1b0.len = *(long *)(lhs_00 + 0x10) - (long)local_1b0.data;
      iVar3 = CBS_get_asn1(&local_1b0,(CBS *)local_188,*(int *)(lhs_00 + 4) + 1);
      local_200._M_head_impl._0_1_ = iVar3 == 0;
      local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 != 0) {
        testing::Message::Message((Message *)&local_208);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1e8,(internal *)&local_200,
                   (AssertionResult *)"CBS_get_asn1(&cbs, &child, t.tag + 1)","true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x144,(char *)local_1e8);
        testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        if (local_1e8 != (undefined1  [8])&local_1d8) {
          operator_delete((void *)local_1e8,local_1d8._M_allocated_capacity + 1);
        }
        lVar4 = local_198;
        if ((long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_208.data_._4_4_,local_208.data_._0_4_) + 8))();
        }
      }
      if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1f8,local_1f8);
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_1ea);
    if (uVar2 == '\0') break;
    lhs_00 = lhs_00 + 0x20;
    bVar6 = lVar4 != 0;
    lVar4 = lVar4 + -0x20;
  } while (bVar6);
  lVar4 = 0x140;
  do {
    pvVar1 = *(void **)((long)&uStack_190 + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_178 + lVar4 + -8) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != 0);
  return;
}

Assistant:

TEST(CBSTest, ParseASN1Tag) {
  const struct {
    bool ok;
    CBS_ASN1_TAG tag;
    std::vector<uint8_t> in;
  } kTests[] = {
      {true, CBS_ASN1_SEQUENCE, {0x30, 0}},
      {true, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 4, {0xa4, 0}},
      {true, CBS_ASN1_APPLICATION | 30, {0x5e, 0}},
      {true, CBS_ASN1_APPLICATION | 31, {0x5f, 0x1f, 0}},
      {true, CBS_ASN1_APPLICATION | 32, {0x5f, 0x20, 0}},
      {true,
       CBS_ASN1_PRIVATE | CBS_ASN1_CONSTRUCTED | 0x1fffffff,
       {0xff, 0x81, 0xff, 0xff, 0xff, 0x7f, 0}},
      // Tag number fits in |uint32_t| but not |CBS_ASN1_TAG_NUMBER_MASK|.
      {false, 0, {0xff, 0x82, 0xff, 0xff, 0xff, 0x7f, 0}},
      // Tag number does not fit in |uint32_t|.
      {false, 0, {0xff, 0x90, 0x80, 0x80, 0x80, 0, 0}},
      // Tag number is not minimally-encoded
      {false, 0, {0x5f, 0x80, 0x1f, 0}},
      // Tag number should have used short form.
      {false, 0, {0x5f, 0x80, 0x1e, 0}},
  };
  for (const auto &t : kTests) {
    SCOPED_TRACE(Bytes(t.in));
    CBS_ASN1_TAG tag;
    CBS cbs, child;
    CBS_init(&cbs, t.in.data(), t.in.size());
    ASSERT_EQ(t.ok, !!CBS_get_any_asn1(&cbs, &child, &tag));
    if (t.ok) {
      EXPECT_EQ(t.tag, tag);
      EXPECT_EQ(0u, CBS_len(&child));
      EXPECT_EQ(0u, CBS_len(&cbs));

      CBS_init(&cbs, t.in.data(), t.in.size());
      EXPECT_TRUE(CBS_peek_asn1_tag(&cbs, t.tag));
      EXPECT_FALSE(CBS_peek_asn1_tag(&cbs, t.tag + 1));

      EXPECT_TRUE(CBS_get_asn1(&cbs, &child, t.tag));
      EXPECT_EQ(0u, CBS_len(&child));
      EXPECT_EQ(0u, CBS_len(&cbs));

      CBS_init(&cbs, t.in.data(), t.in.size());
      EXPECT_FALSE(CBS_get_asn1(&cbs, &child, t.tag + 1));
    }
  }
}